

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5StorageIntegrityCallback
              (void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  int iVar1;
  uint nTerm;
  ulong uVar2;
  uint nTerm_00;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int bPresent;
  int local_4c;
  long local_48;
  Fts5Termset *local_40;
  long local_38;
  
  nTerm_00 = 0x8000;
  if (nToken < 0x8000) {
    nTerm_00 = nToken;
  }
  iVar4 = *(int *)((long)pContext + 0xc);
  if ((tflags & 1U) == 0) {
    iVar4 = iVar4 + 1;
LAB_001adb33:
    *(int *)((long)pContext + 0xc) = iVar4;
  }
  else if (iVar4 == 0) {
    iVar4 = 1;
    goto LAB_001adb33;
  }
  local_40 = *(Fts5Termset **)((long)pContext + 0x18);
  iVar1 = *(int *)(*(long *)((long)pContext + 0x20) + 0x5c);
  if (iVar1 == 2) {
    iVar4 = *(int *)((long)pContext + 8);
  }
  else {
    if (iVar1 == 0) {
      iVar4 = iVar4 + -1;
      local_48 = (long)*(int *)((long)pContext + 8);
      goto LAB_001adb70;
    }
    iVar4 = 0;
  }
  local_48 = 0;
LAB_001adb70:
  iVar1 = sqlite3Fts5TermsetAdd(local_40,0,pToken,nTerm_00,&local_4c);
  if (local_4c == 0 && iVar1 == 0) {
    uVar2 = ((long)iVar4 + (*pContext * 9 + local_48) * 9) * 9 + 0x30;
    if (0 < nToken) {
      uVar3 = 0;
      do {
        uVar2 = uVar2 * 9 + (long)pToken[uVar3];
        uVar3 = uVar3 + 1;
      } while (nTerm_00 != uVar3);
    }
    *(ulong *)((long)pContext + 0x10) = *(ulong *)((long)pContext + 0x10) ^ uVar2;
  }
  if (iVar1 == 0) {
    local_38 = (long)iVar4;
    lVar5 = 0;
    do {
      if (*(int *)(*(long *)((long)pContext + 0x20) + 0x30) <= lVar5) {
        return 0;
      }
      nTerm = sqlite3Fts5IndexCharlenToBytelen
                        (pToken,nTerm_00,
                         *(int *)(*(long *)(*(long *)((long)pContext + 0x20) + 0x38) + lVar5 * 4));
      if (nTerm == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = sqlite3Fts5TermsetAdd(local_40,(int)(lVar5 + 1),pToken,nTerm,&local_4c);
        if (local_4c == 0) {
          uVar2 = (local_38 + (*pContext * 9 + local_48) * 9) * 9 + 0x31 + lVar5;
          if (0 < (int)nTerm) {
            uVar3 = 0;
            do {
              uVar2 = uVar2 * 9 + (long)pToken[uVar3];
              uVar3 = uVar3 + 1;
            } while (nTerm != uVar3);
          }
          *(ulong *)((long)pContext + 0x10) = *(ulong *)((long)pContext + 0x10) ^ uVar2;
        }
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

static int fts5StorageIntegrityCallback(
  void *pContext,                 /* Pointer to Fts5IntegrityCtx object */
  int tflags,
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  Fts5IntegrityCtx *pCtx = (Fts5IntegrityCtx*)pContext;
  Fts5Termset *pTermset = pCtx->pTermset;
  int bPresent;
  int ii;
  int rc = SQLITE_OK;
  int iPos;
  int iCol;

  UNUSED_PARAM2(iUnused1, iUnused2);
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( (tflags & FTS5_TOKEN_COLOCATED)==0 || pCtx->szCol==0 ){
    pCtx->szCol++;
  }

  switch( pCtx->pConfig->eDetail ){
    case FTS5_DETAIL_FULL:
      iPos = pCtx->szCol-1;
      iCol = pCtx->iCol;
      break;

    case FTS5_DETAIL_COLUMNS:
      iPos = pCtx->iCol;
      iCol = 0;
      break;

    default:
      assert( pCtx->pConfig->eDetail==FTS5_DETAIL_NONE );
      iPos = 0;
      iCol = 0;
      break;
  }

  rc = sqlite3Fts5TermsetAdd(pTermset, 0, pToken, nToken, &bPresent);
  if( rc==SQLITE_OK && bPresent==0 ){
    pCtx->cksum ^= sqlite3Fts5IndexEntryCksum(
        pCtx->iRowid, iCol, iPos, 0, pToken, nToken
    );
  }

  for(ii=0; rc==SQLITE_OK && ii<pCtx->pConfig->nPrefix; ii++){
    const int nChar = pCtx->pConfig->aPrefix[ii];
    int nByte = sqlite3Fts5IndexCharlenToBytelen(pToken, nToken, nChar);
    if( nByte ){
      rc = sqlite3Fts5TermsetAdd(pTermset, ii+1, pToken, nByte, &bPresent);
      if( bPresent==0 ){
        pCtx->cksum ^= sqlite3Fts5IndexEntryCksum(
            pCtx->iRowid, iCol, iPos, ii+1, pToken, nByte
        );
      }
    }
  }

  return rc;
}